

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RegisteredExtraGeneratorsMap *pRVar2;
  int iVar3;
  _Base_ptr p_Var4;
  pointer ppcVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  GeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  value_type local_68;
  cmake *local_40;
  pointer local_38;
  
  local_38 = (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_68.name.field_2;
  local_40 = this;
  for (ppcVar5 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar5 != local_38;
      ppcVar5 = ppcVar5 + 1) {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[4])(*ppcVar5,&local_88);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)local_88.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
      local_68.name._M_string_length = 0;
      local_68.name.field_2._M_local_buf[0] = '\0';
      local_68.name._M_dataplus._M_p = (pointer)paVar1;
      iVar3 = (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[5])();
      local_68.supportsToolset = SUB41(iVar3,0);
      std::__cxx11::string::_M_assign((string *)&local_68);
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  pRVar2 = &local_40->ExtraGenerators;
  for (p_Var4 = (local_40->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pRVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_68.name._M_string_length = 0;
    local_68.name.field_2._M_local_buf[0] = '\0';
    local_68.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_68);
    local_68.supportsToolset = false;
    std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
              (generators,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators)
{
  for (RegisteredGeneratorsVector::const_iterator
       i = this->Generators.begin(), e = this->Generators.end();
       i != e; ++i)
    {
    std::vector<std::string> names;
    (*i)->GetGenerators(names);

    for (size_t j = 0; j < names.size(); ++j)
      {
      GeneratorInfo info;
      info.supportsToolset = (*i)->SupportsToolset();
      info.name = names[j];
      generators.push_back(info);
      }
    }

  for (RegisteredExtraGeneratorsMap::const_iterator
       i = this->ExtraGenerators.begin(), e = this->ExtraGenerators.end();
       i != e; ++i)
    {
    GeneratorInfo info;
    info.name = i->first;
    info.supportsToolset = false;
    generators.push_back(info);
    }
}